

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.cpp
# Opt level: O0

void si9ma::Trie::delete_str(TrieNode *root,string *str)

{
  TrieNode *pTVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  int local_2c;
  int index;
  int i;
  TrieNode *next;
  TrieNode *cur;
  string *str_local;
  TrieNode *root_local;
  
  iVar2 = search(root,str);
  if (0 < iVar2) {
    root->pass = root->pass + -1;
    next = root;
    for (local_2c = 0; uVar4 = std::__cxx11::string::length(), (ulong)(long)local_2c < uVar4;
        local_2c = local_2c + 1) {
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)str);
      iVar2 = *pcVar5 + -0x61;
      pTVar1 = next->nexts[iVar2];
      iVar3 = next->nexts[iVar2]->pass + -1;
      next->nexts[iVar2]->pass = iVar3;
      if (iVar3 == 0) {
        next->nexts[iVar2] = (TrieNode *)0x0;
      }
      if ((next->pass == 0) && (next != (TrieNode *)0x0)) {
        TrieNode::~TrieNode(next);
        operator_delete(next);
      }
      next = pTVar1;
    }
    next->end = next->end + -1;
    if ((next->pass == 0) && (next != (TrieNode *)0x0)) {
      TrieNode::~TrieNode(next);
      operator_delete(next);
    }
  }
  return;
}

Assistant:

void Trie::delete_str(TrieNode *root,const string &str) {
        if (search(root,str) > 0) {
            root->pass--;
            auto *cur = root;
            auto *next = root;

            for (int i = 0; i < str.length(); ++i) {
                int index = str[i] - 'a';

                next = cur->nexts[index];

                // if next pass == 0,reset cur next ptr to null
                if (--cur->nexts[index]->pass == 0)
                    cur->nexts[index] = nullptr;

                // delete cur,if pass == 0
                if (cur->pass == 0)
                    delete cur;

                cur = next;
            }

            cur->end--;

            // delete last is pass == null
            if (cur->pass == 0)
                delete cur;
        }
    }